

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_237::InfoCollector::receiveChildValue
          (InfoCollector *this,Expression *child,Expression *parent)

{
  Type *this_00;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  Type type;
  ulong uVar4;
  uint uVar5;
  _Variadic_union<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
  local_88;
  undefined1 local_68;
  Expression *local_60;
  Index local_58;
  undefined1 local_40;
  Type *local_38;
  
  if (parent != (Expression *)0x0) {
    type.id = (uintptr_t)child;
    bVar1 = isRelevant((InfoCollector *)(parent->type).id,(Type)child);
    if ((child != (Expression *)0x0) && (bVar1)) {
      bVar1 = isRelevant((InfoCollector *)(child->type).id,type);
      if (bVar1) {
        this_00 = &child->type;
        sVar2 = wasm::Type::size(this_00);
        sVar3 = wasm::Type::size(&parent->type);
        if (sVar2 != sVar3) {
          __assert_fail("child->type.size() == parent->type.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/possible-contents.cpp"
                        ,0x4da,
                        "void wasm::(anonymous namespace)::InfoCollector::receiveChildValue(Expression *, Expression *)"
                       );
        }
        sVar2 = wasm::Type::size(this_00);
        if (sVar2 != 0) {
          uVar5 = 1;
          local_38 = this_00;
          do {
            local_88._M_first._M_storage.tupleIndex = uVar5 - 1;
            local_68 = 0;
            local_40 = 0;
            local_88._M_first._M_storage.expr = child;
            local_60 = parent;
            local_58 = local_88._M_first._M_storage.tupleIndex;
            std::
            vector<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::allocator<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>_>_>
            ::push_back(&this->info->links,(value_type *)&local_88._M_first);
            uVar4 = (ulong)uVar5;
            sVar2 = wasm::Type::size(local_38);
            uVar5 = uVar5 + 1;
          } while (uVar4 < sVar2);
        }
      }
    }
  }
  return;
}

Assistant:

void receiveChildValue(Expression* child, Expression* parent) {
    if (isRelevant(parent) && isRelevant(child)) {
      // The tuple sizes must match (or, if not a tuple, the size should be 1 in
      // both cases).
      assert(child->type.size() == parent->type.size());
      for (Index i = 0; i < child->type.size(); i++) {
        info.links.push_back(
          {ExpressionLocation{child, i}, ExpressionLocation{parent, i}});
      }
    }
  }